

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::check_leadership_transfer(raft_server *this)

{
  uint uVar1;
  ulong uVar2;
  element_type *peVar3;
  element_type *peVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  uint64_t uVar8;
  __node_base *p_Var9;
  uint uVar10;
  uint local_84;
  ptr<peer> peer_elem;
  ptr<raft_params> params;
  unique_lock<std::recursive_mutex> guard;
  
  nuraft::context::get_params((context *)&params);
  if (*(int *)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              0x44) != 0) {
    bVar5 = timer_helper::timeout(&this->leadership_transfer_timer_);
    if (bVar5) {
      nuraft::context::get_params((context *)&peer_elem);
      iVar7 = *(int *)&((peer_elem.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->config_).
                       super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&peer_elem.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::unique_lock<std::recursive_mutex>::unique_lock(&guard,&this->lock_);
      uVar10 = this->my_priority_;
      uVar2 = (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
      p_Var9 = &(this->peers_)._M_h._M_before_begin;
      local_84 = 0xffffffff;
      do {
        p_Var9 = p_Var9->_M_nxt;
        if (p_Var9 == (__node_base *)0x0) {
          if ((local_84 != 0xffffffff && this->my_priority_ < (int)uVar10) &&
             (cVar6 = (**(code **)(*(long *)(this->state_machine_).
                                            super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr + 0xa0))(), cVar6 != '\0')) {
            peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if ((peVar4 != (element_type *)0x0) &&
               (iVar7 = (**(code **)(*(long *)peVar4 + 0x38))(), 3 < iVar7)) {
              peVar4 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              uVar1 = this->my_priority_;
              uVar8 = timer_helper::get_sec(&this->leadership_transfer_timer_);
              msg_if_given_abi_cxx11_
                        ((string *)&peer_elem,
                         "going to transfer leadership to %d, my priority %d, max priority %d, has been leader for %lu sec"
                         ,(ulong)local_84,(ulong)uVar1,(ulong)uVar10,uVar8);
              (**(code **)(*(long *)peVar4 + 0x40))
                        (peVar4,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                         ,"check_leadership_transfer",0x492,&peer_elem);
              std::__cxx11::string::~string((string *)&peer_elem);
            }
            yield_leadership(this,false,local_84);
          }
          break;
        }
        std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&peer_elem.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)(p_Var9 + 2));
        peVar3 = ((peer_elem.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar1 = peVar3->priority_;
        if ((int)uVar10 < (int)uVar1) {
          local_84 = peVar3->id_;
          uVar10 = uVar1;
        }
        if ((long)*(int *)(params.
                           super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 0x34) +
            (peer_elem.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            matched_idx_ < uVar2) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&peer_elem.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          break;
        }
        uVar8 = timer_helper::get_us
                          (&(peer_elem.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->last_resp_timer_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&peer_elem.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      } while (uVar8 / 1000 <= (ulong)(long)iVar7);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void raft_server::check_leadership_transfer() {
    ptr<raft_params> params = ctx_->get_params();
    if (!params->leadership_transfer_min_wait_time_) {
        // Transferring leadership is disabled.
        return;
    }
    if (!leadership_transfer_timer_.timeout()) {
        // Leadership period is too short.
        return;
    }

    size_t hb_interval_ms = ctx_->get_params()->heart_beat_interval_;

    recur_lock(lock_);

    int32 successor_id = -1;
    int32 max_priority = my_priority_;
    ulong cur_commit_idx = quick_commit_index_;
    for (auto& entry: peers_) {
        ptr<peer> peer_elem = entry.second;
        const srv_config& s_conf = peer_elem->get_config();
        int32 cur_priority = s_conf.get_priority();
        if (cur_priority > max_priority) {
            max_priority = cur_priority;
            successor_id = s_conf.get_id();
        }

        if (peer_elem->get_matched_idx() + params->stale_log_gap_ <
                cur_commit_idx) {
            // This peer is lagging behind.
            return;
        }

        uint64_t last_resp_ms = peer_elem->get_resp_timer_us() / 1000;
        if (last_resp_ms > hb_interval_ms) {
            // This replica is not responding.
            return;
        }
    }

    if (my_priority_ >= max_priority || successor_id == -1) {
        // This leader already has the highest priority.
        return;
    }

    if (!state_machine_->allow_leadership_transfer()) {
        // Although all conditions are met,
        // user does not want to transfer the leadership.
        return;
    }

    p_in( "going to transfer leadership to %d, "
          "my priority %d, max priority %d, "
          "has been leader for %" PRIu64 " sec",
          successor_id, my_priority_, max_priority,
          leadership_transfer_timer_.get_sec() );
    yield_leadership(false, successor_id);
}